

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation.cpp
# Opt level: O1

void __thiscall
cp::interpolation<float>::setInter5
          (interpolation<float> *this,float xb,float dxb,float ddxb,float xe,float dxe,float ddxe,
          double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  this->a[0] = xb;
  this->a[1] = dxb;
  this->a[2] = ddxb * 0.5;
  dVar7 = (double)xe;
  dVar3 = (double)xb;
  dVar4 = (double)dxe;
  dVar1 = (double)dxb;
  dVar5 = (double)ddxe;
  dVar6 = t * t;
  dVar2 = pow(t,3.0);
  this->a[3] = (float)((((dVar7 * 20.0 + dVar3 * -20.0) - (dVar4 * 8.0 + dVar1 * 12.0) * t) -
                       ((double)ddxb * 3.0 - dVar5) * dVar6) / (dVar2 + dVar2));
  dVar2 = pow(t,4.0);
  this->a[4] = (float)((((double)ddxb * 3.0 - (dVar5 + dVar5)) * dVar6 +
                       (dVar4 * 14.0 + dVar1 * 16.0) * t + dVar3 * 30.0 + dVar7 * -30.0) /
                      (dVar2 + dVar2));
  dVar2 = pow(t,5.0);
  this->a[5] = (float)((((dVar7 * 12.0 + dVar3 * -12.0) - (dVar4 * 6.0 + dVar1 * 6.0) * t) -
                       (double)(ddxb - ddxe) * dVar6) / (dVar2 + dVar2));
  return;
}

Assistant:

void interpolation<T>::setInter5(T xb, T dxb, T ddxb, T xe, T dxe, T ddxe, double t) {
    a[0] = xb;
    a[1] = dxb;
    a[2] = ddxb * 0.5;
    a[3] = (20.0*xe - 20.0*xb - ( 8.0*dxe + 12.0*dxb)*t - (3.0*ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 3));
    a[4] = (30.0*xb - 30.0*xe + (14.0*dxe + 16.0*dxb)*t + (3.0*ddxb - 2.0*ddxe)*pow(t, 2)) / (2.0*pow(t, 4));
    a[5] = (12.0*xe - 12.0*xb - ( 6.0*dxe +  6.0*dxb)*t - (    ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 5));
}